

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O2

void __thiscall test::FunctionTimer::Print(FunctionTimer *this,uint trials)

{
  ostringstream *poVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined1 auVar4 [16];
  OutputWorker *pOVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [64];
  undefined1 in_XMM2 [16];
  undefined1 auVar9 [16];
  LogStringBuffer local_1b0;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  if (trials == 1) {
    if (2 < DAT_0010f268) {
      return;
    }
    auVar9 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,this->TotalUsec);
    poVar1 = &local_1b0.LogStream;
    auVar7 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,this->Invokations);
    local_1b0.ChannelName = Logger;
    local_1b0.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&DAT_0010f298);
    std::operator<<((ostream *)poVar1,(string *)&this->FunctionName);
    std::operator<<((ostream *)poVar1," called ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," times.  ");
    std::ostream::_M_insert<double>(auVar9._0_8_ / auVar7._0_8_);
    std::operator<<((ostream *)poVar1," usec avg for all invokations.  ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," usec");
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,&local_1b0);
  }
  else {
    if (2 < DAT_0010f268) {
      return;
    }
    uVar2 = this->Invokations;
    uVar3 = this->TotalUsec;
    poVar1 = &local_1b0.LogStream;
    local_1b0.ChannelName = Logger;
    local_1b0.LogLevel = Info;
    auVar9 = std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    auVar8._0_8_ = auVar9._8_8_;
    auVar6._0_8_ = auVar9._0_8_;
    auVar8._8_56_ = extraout_var_00;
    auVar7 = auVar8._0_16_;
    auVar6._8_56_ = extraout_var;
    auVar9 = auVar6._0_16_;
    std::operator<<((ostream *)poVar1,(string *)&DAT_0010f298);
    std::operator<<((ostream *)poVar1,(string *)&this->FunctionName);
    std::operator<<((ostream *)poVar1," called ");
    auVar9 = vcvtusi2ss_avx512f(auVar9,uVar2);
    auVar4 = vcvtusi2ss_avx512f(auVar7,trials);
    std::ostream::operator<<((ostream *)poVar1,auVar9._0_4_ / auVar4._0_4_);
    std::operator<<((ostream *)poVar1," times per trial (avg).  ");
    auVar9 = vcvtusi2sd_avx512f(in_XMM2,uVar3);
    auVar7 = vcvtusi2sd_avx512f(in_XMM2,uVar2);
    std::ostream::_M_insert<double>(auVar9._0_8_ / auVar7._0_8_);
    std::operator<<((ostream *)poVar1," usec avg for all invokations.  ");
    auVar9 = vcvtusi2ss_avx512f(in_XMM2,uVar3);
    std::ostream::operator<<((ostream *)poVar1,auVar9._0_4_ / auVar4._0_4_);
    std::operator<<((ostream *)poVar1," usec (avg) of ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," trials");
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,&local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.LogStream);
  return;
}

Assistant:

void FunctionTimer::Print(unsigned trials)
{
    if (trials == 1)
    {
        Logger.Info(FunctionName, " called ", Invokations, " times.  ", TotalUsec / (double)Invokations, " usec avg for all invokations.  ", TotalUsec, " usec");
    }
    else
    {
        Logger.Info(FunctionName, " called ", Invokations / (float)trials, " times per trial (avg).  ", TotalUsec / (double)Invokations, " usec avg for all invokations.  ", TotalUsec / (float)trials, " usec (avg) of ", trials, " trials");
    }
}